

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTests.cpp
# Opt level: O0

void vkt::DynamicState::anon_unknown_1::createChildren(TestCaseGroup *group)

{
  TestContext *testCtx_00;
  TestNode *pTVar1;
  TestContext *testCtx;
  TestCaseGroup *group_local;
  
  testCtx_00 = tcu::TestNode::getTestContext(&group->super_TestNode);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateVPTests::DynamicStateVPTests((DynamicStateVPTests *)pTVar1,testCtx_00);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateRSTests::DynamicStateRSTests((DynamicStateRSTests *)pTVar1,testCtx_00);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateCBTests::DynamicStateCBTests((DynamicStateCBTests *)pTVar1,testCtx_00);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateDSTests::DynamicStateDSTests((DynamicStateDSTests *)pTVar1,testCtx_00);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateGeneralTests::DynamicStateGeneralTests((DynamicStateGeneralTests *)pTVar1,testCtx_00);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* group)
{
	tcu::TestContext&	testCtx		= group->getTestContext();

	group->addChild(new DynamicStateVPTests(testCtx));
	group->addChild(new DynamicStateRSTests(testCtx));
	group->addChild(new DynamicStateCBTests(testCtx));
	group->addChild(new DynamicStateDSTests(testCtx));
	group->addChild(new DynamicStateGeneralTests(testCtx));
}